

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.h
# Opt level: O2

void __thiscall
slang::ast::RangeSelectExpression::visitExprs<slang::ast::DistVarVisitor&>
          (RangeSelectExpression *this,DistVarVisitor *visitor)

{
  Expression::visit<slang::ast::DistVarVisitor&>(this->value_,visitor);
  Expression::visit<slang::ast::DistVarVisitor&>(this->left_,visitor);
  Expression::visit<slang::ast::DistVarVisitor&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        value().visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }